

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

void __thiscall
Sequence::make_itemset(Sequence *this,Itemset_S *it,Array_S *ary,int cnt,vint *clscnt)

{
  Array *this_00;
  element_type *peVar1;
  Array *this_01;
  int iVar2;
  long lVar3;
  uint index;
  
  index = 0;
  while( true ) {
    this_00 = (ary->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar1 = (it->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this_00->theSize <= (int)index) break;
    this_01 = (peVar1->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = Array::operator[](this_00,index);
    Array::add(this_01,iVar2);
    index = index + 1;
  }
  peVar1->theSupport = cnt;
  lVar3 = 0;
  while( true ) {
    iVar2 = ClassInfo::get_num_class
                      ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    if (iVar2 <= lVar3) break;
    (((it->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->clsSup).
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[lVar3] =
         (clscnt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start[lVar3];
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void Sequence::make_itemset(Itemset_S& it, Array_S& ary, int cnt, const vint &clscnt) {
    int i;
    for (i = 0; i < ary->size(); i++) {
        it->ival()->optadd((*ary)[i]);
    }
    it->set_support(cnt);
    for (i = 0; i < cls->get_num_class(); i++) it->set_cls_support(clscnt[i], i);
}